

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O2

HermiteSpline<5U,_2U> *
HermiteSpline<5U,_2U>::fit
          (HermiteSpline<5U,_2U> *__return_storage_ptr__,
          array<Eigen::Matrix<double,_2,__1,_0,_2,__1>,_3UL> *values)

{
  Index IVar1;
  int j;
  long lVar2;
  UnitBoundedPolynomial<5U,_2U> *pUVar3;
  value_type *pvVar4;
  long lVar5;
  Matrix<double,_2,__1,_0,_2,__1> *xpr;
  byte bVar6;
  Matrix<double,_2,_3,_0,_2,_3> local_1f8;
  Matrix<double,_2,_3,_0,_2,_3> local_1c8;
  Matrix<double,_2,_3,_1,_2,_3> A;
  Matrix<double,_2,_3,_1,_2,_3> B;
  Block<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_2,_1,_false> local_130;
  UnitBoundedPolynomial<5U,_2U> local_100;
  value_type local_98;
  
  bVar6 = 0;
  IVar1 = values->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,_2,__1,_0,_2,__1>_>.
          m_storage.m_cols;
  HermiteSpline(__return_storage_ptr__);
  lVar5 = -1;
  while (lVar5 < (int)IVar1 + -1) {
    lVar2 = 0;
    xpr = values->_M_elems;
    for (; lVar2 != 3; lVar2 = lVar2 + 1) {
      Eigen::Block<Eigen::Matrix<double,_2,_-1,_0,_2,_-1>,_2,_1,_true>::Block
                ((Block<Eigen::Matrix<double,_2,__1,_0,_2,__1>,_2,_1,_true> *)&local_98,xpr,
                 lVar5 + 1);
      Eigen::Block<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_2,_1,_false>::Block(&local_130,&B,lVar2);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,2,3,1,2,3>,2,1,false>,Eigen::Block<Eigen::Matrix<double,2,_1,0,2,_1>,2,1,true>>
                (&local_130,(Block<Eigen::Matrix<double,_2,__1,_0,_2,__1>,_2,_1,_true> *)&local_98);
      xpr = xpr + 1;
    }
    if (-1 < lVar5) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,2,3,0,2,3>>::
      _set_noalias<Eigen::Matrix<double,2,3,1,2,3>>
                ((PlainObjectBase<Eigen::Matrix<double,2,3,0,2,3>> *)&local_1c8,
                 (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&A);
      Eigen::PlainObjectBase<Eigen::Matrix<double,2,3,0,2,3>>::
      _set_noalias<Eigen::Matrix<double,2,3,1,2,3>>
                ((PlainObjectBase<Eigen::Matrix<double,2,3,0,2,3>> *)&local_1f8,
                 (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&B);
      UnitBoundedPolynomial<5U,_2U>::fit(&local_100,&local_1c8,&local_1f8);
      pUVar3 = &local_100;
      pvVar4 = &local_98;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        pvVar4->_dims[0].coeffs[0] = pUVar3->_dims[0].coeffs[0];
        pUVar3 = (UnitBoundedPolynomial<5U,_2U> *)((long)pUVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pvVar4 = (value_type *)((long)pvVar4 + (ulong)bVar6 * -0x10 + 8);
      }
      std::vector<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>::
      push_back(&__return_storage_ptr__->children,&local_98);
      __return_storage_ptr__->length = local_98.length + __return_storage_ptr__->length;
    }
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,2,3,1,2,3>,Eigen::Matrix<double,2,3,1,2,3>>(&A,&B);
    lVar5 = lVar5 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

HermiteSpline<Order, Dims> HermiteSpline<Order, Dims>::fit(array<MatrixNXd, Polynomial1::RequiredValues> values)
{
    const int N = values[0].cols()-1; // number of splines
    HermiteSpline<Order, Dims> result;

    Matrix<double, Dims, Polynomial1::RequiredValues, RowMajor> A;
    Matrix<double, Dims, Polynomial1::RequiredValues, RowMajor> B;

    for (int k = -1; k < N; ++k)
    {
        for (int j = 0; j < Polynomial1::RequiredValues; ++j)
        {
            B.col(j) = values[j].col(k+1);
        }

        if (k >= 0)
        {
            result.add(UnitBoundedPolynomial<Order, Dims>::fit(A, B));
        }

        A = B;
    }

    return result;
}